

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microui.c
# Opt level: O0

int mu_next_command(mu_Context *ctx,mu_Command **cmd)

{
  mu_Command **cmd_local;
  mu_Context *ctx_local;
  
  if (*cmd == (mu_Command *)0x0) {
    *cmd = (mu_Command *)(ctx->command_list).items;
  }
  else {
    *cmd = (mu_Command *)((long)*cmd + (long)((*cmd)->base).size);
  }
  while( true ) {
    if (*cmd == (mu_Command *)((ctx->command_list).items + (ctx->command_list).idx)) {
      return 0;
    }
    if ((*cmd)->type != 1) break;
    *cmd = (mu_Command *)((*cmd)->jump).dst;
  }
  return 1;
}

Assistant:

int mu_next_command(mu_Context *ctx, mu_Command **cmd) {
  if (*cmd) {
    *cmd = (mu_Command*) (((char*) *cmd) + (*cmd)->base.size);
  } else {
    *cmd = (mu_Command*) ctx->command_list.items;
  }
  while ((char*) *cmd != ctx->command_list.items + ctx->command_list.idx) {
    if ((*cmd)->type != MU_COMMAND_JUMP) { return 1; }
    *cmd = (*cmd)->jump.dst;
  }
  return 0;
}